

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

uint32 __thiscall
Js::RecyclableCollectionObjectWalker<Js::JavascriptWeakMap>::GetChildrenCount
          (RecyclableCollectionObjectWalker<Js::JavascriptWeakMap> *this)

{
  JavascriptWeakMap *pJVar1;
  ArenaAllocator *alloc;
  List<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakMap>,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar2;
  
  pJVar1 = VarTo<Js::JavascriptWeakMap>(this->instance);
  (**(pJVar1->keySet).
     super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
     .super_IWeakReferenceDictionary._vptr_IWeakReferenceDictionary)(&pJVar1->keySet);
  if ((0 < (pJVar1->keySet).
           super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
           .count - (pJVar1->keySet).
                    super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    .freeCount) &&
     (this->propertyList ==
      (List<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakMap>,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0)) {
    alloc = GetArenaFromContext(this->scriptContext);
    pLVar2 = (List<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakMap>,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *)new<Memory::ArenaAllocator>(0x30,alloc,0x366bee);
    (pLVar2->
    super_ReadOnlyList<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakMap>,_Memory::ArenaAllocator,_DefaultComparer>
    ).buffer = (Type)0x0;
    (pLVar2->
    super_ReadOnlyList<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakMap>,_Memory::ArenaAllocator,_DefaultComparer>
    ).count = 0;
    (pLVar2->
    super_ReadOnlyList<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakMap>,_Memory::ArenaAllocator,_DefaultComparer>
    ).alloc = alloc;
    (pLVar2->
    super_ReadOnlyList<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakMap>,_Memory::ArenaAllocator,_DefaultComparer>
    )._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014fa118;
    pLVar2->length = 0;
    pLVar2->increment = 4;
    this->propertyList = pLVar2;
    GetChildren(this);
  }
  (**(pJVar1->keySet).
     super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
     .super_IWeakReferenceDictionary._vptr_IWeakReferenceDictionary)(&pJVar1->keySet);
  return (pJVar1->keySet).
         super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
         .count - (pJVar1->keySet).
                  super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                  .freeCount;
}

Assistant:

uint32 RecyclableCollectionObjectWalker<TData>::GetChildrenCount()
    {
        TData* data = VarTo<TData>(instance);
        if (data->Size() > 0 && propertyList == nullptr)
        {
            propertyList = JsUtil::List<RecyclableCollectionObjectWalkerPropertyData<TData>, ArenaAllocator>::New(GetArenaFromContext(scriptContext));
            GetChildren();
        }

        return data->Size();
    }